

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::utils::RateLimiter_testMaxBalance_Test::TestBody
          (RateLimiter_testMaxBalance_Test *this)

{
  bool bVar1;
  char cVar2;
  duration dVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar5;
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> limiter;
  long *local_a8;
  AssertHelper local_a0 [8];
  char local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88 [2];
  char local_78 [16];
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> local_68;
  
  dVar3.__r = std::chrono::_V2::steady_clock::now();
  local_68._creditsPerSecond = 0.1;
  local_68._maxBalance = 1.0;
  local_68._balance = 1.0;
  local_68._mutex.super___mutex_base._M_mutex.__align = 0;
  local_68._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_68._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_68._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_68._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r;
  local_68._lastTick.__d.__r = (duration)(duration)dVar3.__r;
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,0.0);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98[0] = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da;
    uVar5 = extraout_XMM0_Db;
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1.0)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x48,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_00;
    uVar5 = extraout_XMM0_Db_00;
    if (!bVar1) {
      return;
    }
  }
  _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar3.__r + 20000000000;
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,(double)CONCAT44(uVar5,uVar4));
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98[0] = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_01;
    uVar5 = extraout_XMM0_Db_01;
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1.0)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x4b,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar4 = extraout_XMM0_Da_02;
    uVar5 = extraout_XMM0_Db_02;
    if (!bVar1) {
      return;
    }
  }
  bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                    (&local_68,(double)CONCAT44(uVar5,uVar4));
  local_98[0] = !bVar1;
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,local_98,"limiter.checkCredit(1.0)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x4c,local_88[0]);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if (local_a8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(RateLimiter, testMaxBalance)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(0.1, 1.0);

    ASSERT_TRUE(limiter.checkCredit(1.0));

    currentTime = timestamp + std::chrono::seconds(20);
    ASSERT_TRUE(limiter.checkCredit(1.0));
    ASSERT_FALSE(limiter.checkCredit(1.0));
}